

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteKvIoNewPage(unqlite_kv_handle pHandle,unqlite_page **ppPage)

{
  undefined8 local_38;
  undefined4 local_24;
  int rc;
  Pager *pPager;
  unqlite_page **ppPage_local;
  unqlite_kv_handle pHandle_local;
  
  local_24 = pager_shared_lock((Pager *)pHandle);
  if (local_24 == 0) {
    if (*(long *)((long)pHandle + 0x40) == 0) {
      local_38 = 1;
    }
    else {
      local_38 = *(pgno *)((long)pHandle + 0x40);
    }
    local_24 = unqlitePagerAcquire((Pager *)pHandle,local_38,ppPage,0,0);
  }
  return local_24;
}

Assistant:

static int unqliteKvIoNewPage(unqlite_kv_handle pHandle,unqlite_page **ppPage)
{
	Pager *pPager = (Pager *)pHandle;
	int rc;
	/* 
	 * Acquire a reader-lock first so that pPager->dbSize get initialized.
	 */
	rc = pager_shared_lock(pPager);
	if( rc == UNQLITE_OK ){
		rc = unqlitePagerAcquire(pPager,pPager->dbSize == 0 ? /* Page 0 is reserved */ 1 : pPager->dbSize ,ppPage,0,0);
	}
	return rc;
}